

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  int in_EDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *v;
  ImGuiStoragePair *in_stack_ffffffffffffffd8;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffe0;
  
  pIVar1 = LowerBound(in_RDI,in_ESI);
  v = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((v == pIVar2) || (pIVar1->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd8,in_ESI,in_EDX);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert
              ((ImVector<ImGuiStorage::ImGuiStoragePair> *)in_stack_ffffffffffffffe0.val_p,
               in_stack_ffffffffffffffd8,v);
  }
  else {
    (pIVar1->field_1).val_i = in_EDX;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_i = val;
}